

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_size_is_populated_from_the_subject_list_size_Test::TestBody
          (SubscriptionSyncTest_test_size_is_populated_from_the_subject_list_size_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  unsigned_long local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_90;
  SubscriptionSync local_78 [8];
  SubscriptionSync subscription_sync;
  SubscriptionSyncTest_test_size_is_populated_from_the_subject_list_size_Test *this_local;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_90,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync(local_78,0x7b,&local_90);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_90);
  local_b8 = std::
             vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ::size((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                     *)subject_list);
  local_c0 = bidfx_public_api::price::pixie::SubscriptionSync::GetSize();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_b0,"subject_list.size()","subscription_sync.GetSize()",
             &local_b8,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  SubscriptionSync::~SubscriptionSync(local_78);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_size_is_populated_from_the_subject_list_size)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    ASSERT_EQ(subject_list.size(), subscription_sync.GetSize());
}